

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QString * __thiscall QWidget::styleSheet(QWidget *this)

{
  bool bVar1;
  QString *in_RDI;
  QWidgetPrivate *d;
  QString *this_00;
  
  this_00 = in_RDI;
  d_func((QWidget *)0x3673c8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3673db);
  if (bVar1) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3673f8);
    QString::QString(this_00,in_RDI);
  }
  else {
    QString::QString((QString *)0x3673e8);
  }
  return this_00;
}

Assistant:

QString QWidget::styleSheet() const
{
    Q_D(const QWidget);
    if (!d->extra)
        return QString();
    return d->extra->styleSheet;
}